

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QLocale>::emplace<QLocale>
          (QMovableArrayOps<QLocale> *this,qsizetype i,QLocale *args)

{
  QLocale **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QLocale *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QLocale tmp;
  QLocale local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00322760:
    local_30.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QLocale::QLocale(&local_30,args);
    bVar6 = (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size != 0;
    QArrayDataPointer<QLocale>::detachAndGrow
              ((QArrayDataPointer<QLocale> *)this,(uint)(i == 0 && bVar6),1,(QLocale **)0x0,
               (QArrayDataPointer<QLocale> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr;
    if (i == 0 && bVar6) {
      QLocale::QLocale(pQVar5 + -1,&local_30);
      ppQVar1 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      memmove(pQVar5 + i + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size - i) *
              8);
      QLocale::QLocale(pQVar5 + i,&local_30);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size;
    *pqVar2 = *pqVar2 + 1;
    QLocale::~QLocale(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QLocale::QLocale((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr
                       + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QLocale *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr))
      goto LAB_00322760;
      QLocale::QLocale((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr
                       + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }